

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall
cmDependsFortran::ConsiderModule(cmDependsFortran *this,string *name,string *stampDir)

{
  iterator iVar1;
  string stampFile;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(((this->Internal)._M_t.
                    super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                    .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
                  TargetRequires)._M_t,name);
  if ((iVar1._M_node !=
       (_Base_ptr)
       ((long)&(((this->Internal)._M_t.
                 super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                 .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
               TargetRequires)._M_t + 8U)) && (iVar1._M_node[2]._M_parent == (_Base_ptr)0x0)) {
    local_50.View_._M_str = (stampDir->_M_dataplus)._M_p;
    local_50.View_._M_len = stampDir->_M_string_length;
    local_80.View_._M_str = local_80.Digits_;
    local_80.View_._M_len = 1;
    local_80.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string,char[7]>
              (&local_a0,&local_50,&local_80,name,(char (*) [7])".stamp");
    std::__cxx11::string::_M_assign((string *)(iVar1._M_node + 2));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void cmDependsFortran::ConsiderModule(const std::string& name,
                                      const std::string& stampDir)
{
  // Locate each required module.
  auto required = this->Internal->TargetRequires.find(name);
  if (required != this->Internal->TargetRequires.end() &&
      required->second.empty()) {
    // The module is provided by a CMake target.  It will have a stamp file.
    std::string stampFile = cmStrCat(stampDir, '/', name, ".stamp");
    required->second = stampFile;
  }
}